

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_multi_assign_reference.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformMultiAssignRef(Transformer *this,PGMultiAssignRef *root)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  PGValue *pPVar4;
  ParserException *pPVar5;
  long lVar6;
  long in_RDX;
  long lVar7;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  optional_ptr<duckdb_libpgquery::PGValue,_true> function;
  
  piVar1 = *(int **)(in_RDX + 8);
  if (*piVar1 == 0x165) {
    lVar2 = *(long *)(piVar1 + 4);
    function.ptr = (PGValue *)**(undefined8 **)(*(long *)(piVar1 + 2) + 0x10);
    pPVar4 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&function);
    if ((pPVar4->val).str != (char *)0x0) {
      ::std::__cxx11::string::string((string *)&local_78,(pPVar4->val).str,&local_79);
      ::std::__cxx11::string::string((string *)&local_58,"row",&local_7a);
      bVar3 = StringUtil::CIEquals(&local_78,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::__cxx11::string::~string((string *)&local_78);
      if (bVar3) {
        if (lVar2 == 0) {
          lVar7 = 0;
        }
        else {
          lVar7 = (long)*(int *)(lVar2 + 4);
          if (*(int *)(lVar2 + 4) <= *(int *)(in_RDX + 0x14)) {
            lVar6 = 1;
            lVar7 = lVar2;
            do {
              lVar7 = *(long *)(lVar7 + 8);
              if (lVar7 == 0) break;
              bVar3 = lVar6 < *(int *)(in_RDX + 0x10);
              lVar6 = lVar6 + 1;
            } while (bVar3);
            if (lVar7 == 0) {
              pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_78,
                         "Could not perform assignment, expected %d values, got %d",
                         (allocator *)&local_58);
              ParserException::ParserException<int,int>
                        (pPVar5,(string *)&local_78,*(int *)(in_RDX + 0x14),*(int *)(lVar2 + 4));
              __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            goto LAB_01354b99;
          }
        }
        pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_78,"Could not perform assignment, expected %d values, got %d",
                   (allocator *)&local_58);
        ParserException::ParserException<int,long>
                  (pPVar5,(string *)&local_78,*(int *)(in_RDX + 0x14),lVar7);
        __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
LAB_01354b99:
  TransformExpression(this,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformMultiAssignRef(duckdb_libpgquery::PGMultiAssignRef &root) {

	// Early-out, if the root is not a function call.
	if (root.source->type != duckdb_libpgquery::T_PGFuncCall) {
		return TransformExpression(root.source);
	}

	auto func = PGCast<duckdb_libpgquery::PGFuncCall>(*root.source);

	// Only allow ROW function.
	auto function = PGPointerCast<duckdb_libpgquery::PGValue>(func.funcname->tail->data.ptr_value);
	char const *function_name = function->val.str;
	if (!function_name || !StringUtil::CIEquals(function_name, "row")) {
		return TransformExpression(root.source);
	}

	// Too many columns, e.g., (x, y) != (1, 2, 3).
	int64_t value_count = func.args ? func.args->length : 0;
	if (int64_t(root.ncolumns) < value_count || !func.args) {
		throw ParserException("Could not perform assignment, expected %d values, got %d", root.ncolumns, value_count);
	}

	// Get the expression corresponding with the current column.
	int64_t idx = 1;
	auto list = func.args->head;
	while (list && idx < int64_t(root.colno)) {
		list = list->next;
		++idx;
	}

	// Not enough columns, e.g., (x, y, z) != (1, 2).
	if (!list) {
		throw ParserException("Could not perform assignment, expected %d values, got %d", root.ncolumns,
		                      func.args->length);
	}

	auto node = PGPointerCast<duckdb_libpgquery::PGNode>(list->data.ptr_value);
	return TransformExpression(node);
}